

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# write_ahead_log.cpp
# Opt level: O2

void __thiscall duckdb::ChecksumWriter::Flush(ChecksumWriter *this)

{
  optional_ptr<duckdb::WriteStream,_true> *this_00;
  BufferedFileWriter *pBVar1;
  data_ptr_t pdVar2;
  idx_t iVar3;
  uint64_t uVar4;
  WriteStream *pWVar5;
  MemoryStream *this_01;
  idx_t local_30;
  
  this_00 = &this->stream;
  if ((this->stream).ptr == (WriteStream *)0x0) {
    pBVar1 = WriteAheadLog::Initialize(this->wal);
    (this->stream).ptr = &pBVar1->super_WriteStream;
  }
  this_01 = &this->memory_stream;
  pdVar2 = MemoryStream::GetData(this_01);
  iVar3 = MemoryStream::GetPosition(this_01);
  uVar4 = Checksum(pdVar2,iVar3);
  pWVar5 = optional_ptr<duckdb::WriteStream,_true>::operator->(this_00);
  local_30 = iVar3;
  (**pWVar5->_vptr_WriteStream)(pWVar5,&local_30,8);
  pWVar5 = optional_ptr<duckdb::WriteStream,_true>::operator->(this_00);
  local_30 = uVar4;
  (**pWVar5->_vptr_WriteStream)(pWVar5,&local_30,8);
  pWVar5 = optional_ptr<duckdb::WriteStream,_true>::operator->(this_00);
  pdVar2 = MemoryStream::GetData(this_01);
  iVar3 = MemoryStream::GetPosition(this_01);
  (**pWVar5->_vptr_WriteStream)(pWVar5,pdVar2,iVar3);
  MemoryStream::Rewind(this_01);
  return;
}

Assistant:

void Flush() {
		if (!stream) {
			stream = wal.Initialize();
		}
		auto data = memory_stream.GetData();
		auto size = memory_stream.GetPosition();
		// compute the checksum over the entry
		auto checksum = Checksum(data, size);
		// write the checksum and the length of the entry
		stream->Write<uint64_t>(size);
		stream->Write<uint64_t>(checksum);
		// write data to the underlying stream
		stream->WriteData(memory_stream.GetData(), memory_stream.GetPosition());
		// rewind the buffer
		memory_stream.Rewind();
	}